

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O2

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::LineNumberExtendedOps,_void>::enumeration
               (IO *io,LineNumberExtendedOps *value)

{
  IO::enumCase<llvm::dwarf::LineNumberExtendedOps>
            (io,value,"DW_LNE_end_sequence",DW_LNE_end_sequence);
  IO::enumCase<llvm::dwarf::LineNumberExtendedOps>(io,value,"DW_LNE_set_address",DW_LNE_set_address)
  ;
  IO::enumCase<llvm::dwarf::LineNumberExtendedOps>(io,value,"DW_LNE_define_file",DW_LNE_define_file)
  ;
  IO::enumCase<llvm::dwarf::LineNumberExtendedOps>
            (io,value,"DW_LNE_set_discriminator",DW_LNE_set_discriminator);
  IO::enumFallback<llvm::yaml::Hex16,llvm::dwarf::LineNumberExtendedOps>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::LineNumberExtendedOps &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex16>(value);
  }